

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_feature_enable
          (InstanceBuilder *this,VkValidationFeatureEnableEXT enable)

{
  iterator __position;
  VkValidationFeatureEnableEXT local_c;
  
  __position._M_current =
       (this->info).enabled_validation_features.
       super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->info).enabled_validation_features.
      super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_c = enable;
    std::vector<VkValidationFeatureEnableEXT,std::allocator<VkValidationFeatureEnableEXT>>::
    _M_realloc_insert<VkValidationFeatureEnableEXT_const&>
              ((vector<VkValidationFeatureEnableEXT,std::allocator<VkValidationFeatureEnableEXT>> *)
               &(this->info).enabled_validation_features,__position,&local_c);
  }
  else {
    *__position._M_current = enable;
    (this->info).enabled_validation_features.
    super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_feature_enable(VkValidationFeatureEnableEXT enable) {
    info.enabled_validation_features.push_back(enable);
    return *this;
}